

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall vkt::api::anon_unknown_1::ThreadGroupThread::run(ThreadGroupThread *this)

{
  TestException *e;
  exception *e_1;
  ThreadGroupThread *this_local;
  
  (*(this->super_Thread)._vptr_Thread[3])();
  de::SpinBarrier::removeThread(this->m_barrier,WAIT_MODE_AUTO);
  return;
}

Assistant:

void ThreadGroupThread::run (void)
{
	try
	{
		runThread();
	}
	catch (const tcu::TestException& e)
	{
		getResultCollector().addResult(e.getTestResult(), e.getMessage());
	}
	catch (const std::exception& e)
	{
		getResultCollector().addResult(QP_TEST_RESULT_FAIL, e.what());
	}
	catch (...)
	{
		getResultCollector().addResult(QP_TEST_RESULT_FAIL, "Exception");
	}

	m_barrier->removeThread(de::SpinBarrier::WAIT_MODE_AUTO);
}